

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O1

void __thiscall SocketLog::startSendThread(SocketLog *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  long *local_18;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  local_18 = (long *)operator_new(0x10);
  *local_18 = (long)&PTR___State_00107d48;
  local_18[1] = (long)this;
  std::thread::_M_start_thread(puVar1,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  return;
}

Assistant:

void SocketLog::startSendThread() {
    new std::thread([this]{
        LOGD("sendThread running...");
        std::string msg;

        while (true) {
            {
                std::unique_lock<std::mutex> lock(msgQueueMutex);
                LOGD("msgQueue.size=%ld, msgQueueCondition will %s", msgQueue.size(),
                     msgQueue.empty() ? "waiting..." : "not wait!");
                msgQueueCondition.wait(lock, [this] { return !msgQueue.empty(); });
                LOGD("msgQueueCondition wake! msgQueue.size=%ld", msgQueue.size());

                msg = std::move(msgQueue.front());
                msgQueue.pop();
            }

            send(msg);
        }
    });
}